

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O3

string * __thiscall
util::variant::GetString_abi_cxx11_(string *__return_storage_ptr__,variant *this)

{
  var_type vVar1;
  pointer pcVar2;
  char *pcVar3;
  char *pcVar4;
  char buf [1024];
  char acStack_428 [1024];
  
  pcVar3 = acStack_428;
  if (this->cache_val[2] != true) {
    this->cache_val[2] = true;
    vVar1 = this->type;
    if (vVar1 == type_bool) {
      pcVar3 = "no";
      if (this->val_bool != false) {
        pcVar3 = "yes";
      }
      pcVar4 = (char *)(this->val_string)._M_string_length;
    }
    else {
      if (vVar1 == type_float) {
        snprintf(acStack_428,0x400,"%g",this->val_float);
      }
      else {
        if (vVar1 != type_int) goto LAB_0019410b;
        snprintf(acStack_428,0x400,"%i",(ulong)(uint)this->val_int);
      }
      pcVar4 = (char *)(this->val_string)._M_string_length;
      strlen(acStack_428);
    }
    std::__cxx11::string::_M_replace((ulong)&this->val_string,0,pcVar4,(ulong)pcVar3);
  }
LAB_0019410b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (this->val_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->val_string)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string variant::GetString() const
{
	if (this->cache_val[type_string])
	{
		return this->val_string;
	}
	this->cache_val[type_string] = true;

	char buf[1024];

	using namespace std;

	switch (this->type)
	{
		case type_int:
			snprintf(buf, 1024, "%i", this->val_int);
			this->val_string = buf;
			break;

		case type_float:
			snprintf(buf, 1024, "%g", this->val_float);
			this->val_string = buf;
			break;

		case type_bool:
			this->val_string = this->val_bool ? "yes" : "no";
			break;

		default: ; // Shut the compiler up
	}

	return this->val_string;
}